

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

void __thiscall
spectest::CommandRunner::PopulateImports(CommandRunner *this,Ptr *module,RefVec *imports)

{
  string *psVar1;
  string *module_00;
  Ptr extern_;
  value_type local_50;
  Ptr local_48;
  
  psVar1 = (string *)
           (module->obj_->desc_).imports.
           super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (module_00 = (string *)
                   (module->obj_->desc_).imports.
                   super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; module_00 != psVar1;
      module_00 = (string *)&module_00[2]._M_string_length) {
    GetImport(&local_48,this,module_00,module_00 + 1);
    if (local_48.obj_ == (Extern *)0x0) {
      local_50.index = 0;
    }
    else {
      local_50.index = (size_t)wabt::interp::RefPtr<wabt::interp::Extern>::ref(&local_48);
    }
    std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back(imports,&local_50)
    ;
    wabt::interp::RefPtr<wabt::interp::Extern>::reset(&local_48);
  }
  return;
}

Assistant:

void CommandRunner::PopulateImports(const interp::Module::Ptr& module,
                                    RefVec* imports) {
  for (auto&& import : module->desc().imports) {
    auto extern_ = GetImport(import.type.module, import.type.name);
    imports->push_back(extern_ ? extern_.ref() : Ref::Null);
  }
}